

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFloatStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::FloatStateQueryVerifiers::GetIntegerVerifier::verifyFloatRange
          (GetIntegerVerifier *this,TestContext *testCtx,GLenum name,GLfloat min,GLfloat max)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  qpTestResult qVar4;
  int (*paiVar5) [2];
  TestLog *this_00;
  MessageBuilder *pMVar6;
  MessageBuilder local_1c8;
  undefined1 local_44 [8];
  StateQueryMemoryWriteGuard<int[2]> range;
  GLint testRangeAsGLint [2];
  GLfloat max_local;
  GLfloat min_local;
  GLenum name_local;
  TestContext *testCtx_local;
  GetIntegerVerifier *this_local;
  
  range.m_postguard[0] = deqp::gls::StateQueryUtil::roundGLfloatToNearestIntegerHalfUp<int>(min);
  range.m_postguard[1] = deqp::gls::StateQueryUtil::roundGLfloatToNearestIntegerHalfDown<int>(max);
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int[2]>::StateQueryMemoryWriteGuard
            ((StateQueryMemoryWriteGuard<int[2]> *)local_44);
  paiVar5 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_function_pointer
                      ((StateQueryMemoryWriteGuard *)local_44);
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_StateVerifier).super_CallLogWrapper,name,*paiVar5);
  bVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int[2]>::verifyValidity
                    ((StateQueryMemoryWriteGuard<int[2]> *)local_44,testCtx);
  iVar1 = range.m_postguard[0];
  if ((bVar3) &&
     ((paiVar5 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                 operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_44),
      iVar2 = range.m_postguard[1], iVar1 < (*paiVar5)[0] ||
      (paiVar5 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                 operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_44),
      (*paiVar5)[1] < iVar2)))) {
    this_00 = tcu::TestContext::getLog(testCtx);
    tcu::TestLog::operator<<(&local_1c8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<(&local_1c8,(char (*) [18])"// ERROR: range [");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,range.m_postguard);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2a3caab);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,range.m_postguard + 1);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x29dc08e);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [19])0x2b7b643);
    paiVar5 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
              operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_44);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,*paiVar5);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2a3caab);
    paiVar5 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
              operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_44);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,*paiVar5 + 1);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x29dc08e);
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1c8);
    qVar4 = tcu::TestContext::getTestResult(testCtx);
    if (qVar4 == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid integer range");
    }
  }
  return;
}

Assistant:

void GetIntegerVerifier::verifyFloatRange (tcu::TestContext& testCtx, GLenum name, GLfloat min, GLfloat max)
{
	using tcu::TestLog;

	const GLint testRangeAsGLint[] =
	{
		StateQueryUtil::roundGLfloatToNearestIntegerHalfUp<GLint>(min),
		StateQueryUtil::roundGLfloatToNearestIntegerHalfDown<GLint>(max)
	};

	StateQueryMemoryWriteGuard<GLint[2]> range;
	glGetIntegerv(name, range);

	if (!range.verifyValidity(testCtx))
		return;

	// check if test range outside of gl state range
	if (testRangeAsGLint[0] < range[0] ||
		testRangeAsGLint[1] > range[1])
	{
		testCtx.getLog() << TestLog::Message
			<< "// ERROR: range ["
			<< testRangeAsGLint[0] << ", "
			<< testRangeAsGLint[1] << "]"
			<< " is not in range ["
			<< range[0] << ", "
			<< range[1] << "]" << TestLog::EndMessage;

		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid integer range");
	}
}